

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::IgnoreField(FieldDescriptor *field)

{
  undefined8 *puVar1;
  int iVar2;
  bool bVar3;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    puVar1 = *(undefined8 **)(*(long *)(field + 0x50) + 0x10);
    iVar2 = std::__cxx11::string::compare((char *)*puVar1);
    if (iVar2 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)*puVar1);
      bVar3 = iVar2 == 0;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool IgnoreExtensionField(const FieldDescriptor* field) {
  // Exclude descriptor extensions from output "to avoid clutter" (from original
  // codegen).
  if (!field->is_extension()) return false;
  const FileDescriptor* file = field->containing_type()->file();
  return file->name() == "net/proto2/proto/descriptor.proto" ||
         file->name() == "google/protobuf/descriptor.proto";
}